

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O0

void Super_WriteLibraryTree(Super_Man_t *pMan)

{
  int iVar1;
  char *__filename;
  FILE *__s;
  Vec_Str_t *p;
  char *__ptr;
  FILE *pFile;
  char *pFileName;
  Vec_Str_t *vStr;
  Super_Man_t *pMan_local;
  
  __filename = Extra_FileNameGenericAppend(pMan->pName,".super");
  __s = fopen(__filename,"wb");
  if (__s == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",__filename);
  }
  else {
    p = Super_WriteLibraryTreeStr(pMan);
    __ptr = Vec_StrArray(p);
    iVar1 = Vec_StrSize(p);
    fwrite(__ptr,1,(long)iVar1,__s);
    fclose(__s);
    Vec_StrFree(p);
    if (pMan->fVerbose != 0) {
      printf("The supergates are written using new format \"%s\" ",__filename);
      iVar1 = Extra_FileSize(__filename);
      printf("(%0.3f MB).\n",(double)iVar1 / 1048576.0);
    }
  }
  return;
}

Assistant:

void Super_WriteLibraryTree( Super_Man_t * pMan )
{
    Vec_Str_t * vStr;
    char * pFileName = Extra_FileNameGenericAppend( pMan->pName, ".super" );
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {     
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    vStr = Super_WriteLibraryTreeStr( pMan );
    fwrite( Vec_StrArray(vStr), 1, Vec_StrSize(vStr), pFile );
    fclose( pFile );
    Vec_StrFree( vStr );
    // report the result of writing
    if ( pMan->fVerbose )
    {
        printf( "The supergates are written using new format \"%s\" ", pFileName );
        printf( "(%0.3f MB).\n", ((double)Extra_FileSize(pFileName))/(1<<20) );
    }
}